

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::AddDirectLinkEntries(cmComputeLinkDepends *this)

{
  pointer pbVar1;
  pointer pcVar2;
  cmLinkImplementation *libs;
  const_iterator cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *language;
  pointer __k;
  pointer item;
  
  libs = cmGeneratorTarget::GetLinkImplementation(this->Target,&this->Config,Link);
  AddLinkEntries<cmLinkImplItem>
            (this,-1,(vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)libs);
  AddLinkObjects(this,&(libs->super_cmLinkImplementationLibraries).Objects);
  pbVar1 = (libs->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (libs->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar1; __k = __k + 1) {
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(libs->LanguageRuntimeLibraries)._M_h,__k);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      AddLinkEntries<cmLinkImplItem>
                (this,-1,(vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)
                         ((long)cVar3.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                                ._M_cur + 0x28));
    }
  }
  pcVar2 = (libs->super_cmLinkImplementationLibraries).WrongConfigLibraries.
           super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (item = (libs->super_cmLinkImplementationLibraries).WrongConfigLibraries.
              super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
              super__Vector_impl_data._M_start; item != pcVar2; item = item + 1) {
    CheckWrongConfigItem(this,item);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddDirectLinkEntries()
{
  // Add direct link dependencies in this configuration.
  cmLinkImplementation const* impl = this->Target->GetLinkImplementation(
    this->Config, cmGeneratorTarget::LinkInterfaceFor::Link);
  this->AddLinkEntries(-1, impl->Libraries);
  this->AddLinkObjects(impl->Objects);

  for (auto const& language : impl->Languages) {
    auto runtimeEntries = impl->LanguageRuntimeLibraries.find(language);
    if (runtimeEntries != impl->LanguageRuntimeLibraries.end()) {
      this->AddLinkEntries(-1, runtimeEntries->second);
    }
  }
  for (cmLinkItem const& wi : impl->WrongConfigLibraries) {
    this->CheckWrongConfigItem(wi);
  }
}